

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Block * __thiscall
soul::heart::Parser::getBlock(Parser *this,FunctionParseState *state,Identifier name)

{
  bool bVar1;
  Block *pBVar2;
  Identifier *args;
  CompileMessage local_68;
  string *local_30;
  undefined1 local_28 [8];
  pool_ptr<soul::heart::Block> b;
  FunctionParseState *state_local;
  Parser *this_local;
  Identifier name_local;
  
  local_30 = name.name;
  b.object = (Block *)state;
  this_local = (Parser *)name.name;
  findBlock((Parser *)local_28,(FunctionParseState *)this,(Identifier)state);
  bVar1 = pool_ptr<soul::heart::Block>::operator==
                    ((pool_ptr<soul::heart::Block> *)local_28,(void *)0x0);
  if (bVar1) {
    Errors::cannotFind<soul::Identifier&>(&local_68,(Errors *)&this_local,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_68);
    CompileMessage::~CompileMessage(&local_68);
  }
  pBVar2 = pool_ptr<soul::heart::Block>::operator*((pool_ptr<soul::heart::Block> *)local_28);
  pool_ptr<soul::heart::Block>::~pool_ptr((pool_ptr<soul::heart::Block> *)local_28);
  return pBVar2;
}

Assistant:

heart::Block& getBlock (const FunctionParseState& state, Identifier name)
    {
        auto b = findBlock (state, name);

        if (b == nullptr)
            throwError (Errors::cannotFind (name));

        return *b;
    }